

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O0

void __thiscall
basisu::etc1_optimizer::refine_solution(etc1_optimizer *this,uint32_t max_refinement_trials)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  color_rgba cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  uint in_ESI;
  potential_solution *in_RDI;
  int bb1;
  int bg1;
  int br1;
  float avg_delta_b_f;
  float avg_delta_g_f;
  float avg_delta_r_f;
  int yd_temp;
  uint32_t s;
  uint32_t r;
  color_rgba base_color;
  int delta_sum_b;
  int delta_sum_g;
  int delta_sum_r;
  int *pInten_table;
  uint8_t *pSelectors;
  uint32_t refinement_trial;
  uint32_t n;
  undefined4 in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff8c;
  uint32_t in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint local_3c;
  byte bStack_37;
  byte bStack_36;
  int local_34;
  int local_30;
  int local_2c;
  byte *local_20;
  uint local_14;
  
  uVar1 = *(uint *)(*(uchar **)&in_RDI->m_coords + 0xc);
  local_14 = 0;
  while( true ) {
    if (in_ESI <= local_14) {
      return;
    }
    local_20 = vector<unsigned_char>::operator[]
                         ((vector<unsigned_char> *)in_RDI,
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    uVar2 = in_RDI[3].m_coords.m_inten_table;
    local_2c = 0;
    local_30 = 0;
    local_34 = 0;
    cVar4 = etc1_solution_coordinates::get_scaled_color
                      ((etc1_solution_coordinates *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    for (local_3c = 0; local_3c < uVar1; local_3c = local_3c + 1) {
      iVar6 = *(int *)(g_etc1_inten_tables + (ulong)*local_20 * 4 + (ulong)uVar2 * 0x10);
      iVar5 = clamp<int>(((uint)cVar4.field_0 & 0xff) + iVar6,0,0xff);
      local_2c = (iVar5 - ((uint)cVar4.field_0 & 0xff)) + local_2c;
      bStack_37 = cVar4.field_0._1_1_;
      iVar5 = clamp<int>((uint)bStack_37 + iVar6,0,0xff);
      local_30 = (iVar5 - (uint)bStack_37) + local_30;
      bStack_36 = cVar4.field_0._2_1_;
      iVar6 = clamp<int>((uint)bStack_36 + iVar6,0,0xff);
      local_34 = (iVar6 - (uint)bStack_36) + local_34;
      local_20 = local_20 + 1;
    }
    if (((local_2c == 0) && (local_30 == 0)) && (local_34 == 0)) break;
    pfVar8 = vec<3U,_float>::operator[]((vec<3U,_float> *)in_RDI,in_stack_ffffffffffffff8c);
    iVar6 = clamp<int>((int)(((*pfVar8 - (float)local_2c / (float)uVar1) *
                             (float)*(int *)&(in_RDI->m_selectors).m_p) / 255.0 + 0.5),0,
                       *(int *)&(in_RDI->m_selectors).m_p);
    pfVar8 = vec<3U,_float>::operator[]((vec<3U,_float> *)in_RDI,in_stack_ffffffffffffff8c);
    iVar5 = clamp<int>((int)(((*pfVar8 - (float)local_30 / (float)uVar1) *
                             (float)*(int *)&(in_RDI->m_selectors).m_p) / 255.0 + 0.5),0,
                       *(int *)&(in_RDI->m_selectors).m_p);
    pfVar8 = vec<3U,_float>::operator[]((vec<3U,_float> *)in_RDI,in_stack_ffffffffffffff8c);
    iVar7 = clamp<int>((int)(((*pfVar8 - (float)local_34 / (float)uVar1) *
                             (float)*(int *)&(in_RDI->m_selectors).m_p) / 255.0 + 0.5),0,
                       *(int *)&(in_RDI->m_selectors).m_p);
    etc1_solution_coordinates::etc1_solution_coordinates
              ((etc1_solution_coordinates *)CONCAT44(iVar7,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,(uint32_t)((ulong)in_RDI >> 0x20)
               ,(uint32_t)in_RDI,SUB41(in_stack_ffffffffffffff8c >> 0x18,0));
    bVar3 = evaluate_solution((etc1_optimizer *)CONCAT44(iVar6,iVar5),
                              (etc1_solution_coordinates *)CONCAT44(iVar7,in_stack_ffffffffffffffa0)
                              ,(potential_solution *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),in_RDI)
    ;
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      return;
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void etc1_optimizer::refine_solution(uint32_t max_refinement_trials)
	{
		// Now we have the input block, the avg. color of the input pixels, a set of trial selector indices, and the block color+intensity index.
		// Now, for each component, attempt to refine the current solution by solving a simple linear equation. For example, for 4 colors:
		// The goal is:
		// pixel0 - (block_color+inten_table[selector0]) + pixel1 - (block_color+inten_table[selector1]) + pixel2 - (block_color+inten_table[selector2]) + pixel3 - (block_color+inten_table[selector3]) = 0
		// Rearranging this:
		// (pixel0 + pixel1 + pixel2 + pixel3) - (block_color+inten_table[selector0]) - (block_color+inten_table[selector1]) - (block_color+inten_table[selector2]) - (block_color+inten_table[selector3]) = 0
		// (pixel0 + pixel1 + pixel2 + pixel3) - block_color - inten_table[selector0] - block_color-inten_table[selector1] - block_color-inten_table[selector2] - block_color-inten_table[selector3] = 0
		// (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - inten_table[selector0] - inten_table[selector1] - inten_table[selector2] - inten_table[selector3] = 0
		// (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3]) = 0
		// (pixel0 + pixel1 + pixel2 + pixel3)/4 - block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4 = 0
		// block_color = (pixel0 + pixel1 + pixel2 + pixel3)/4 - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4
		// So what this means:
		// optimal_block_color = avg_input - avg_inten_delta
		// So the optimal block color can be computed by taking the average block color and subtracting the current average of the intensity delta.
		// Unfortunately, optimal_block_color must then be quantized to 555 or 444 so it's not always possible to improve matters using this formula.
		// Also, the above formula is for unclamped intensity deltas. The actual implementation takes into account clamping.

		const uint32_t n = m_pParams->m_num_src_pixels;

		for (uint32_t refinement_trial = 0; refinement_trial < max_refinement_trials; refinement_trial++)
		{
			const uint8_t* pSelectors = &m_best_solution.m_selectors[0];
			const int* pInten_table = g_etc1_inten_tables[m_best_solution.m_coords.m_inten_table];

			int delta_sum_r = 0, delta_sum_g = 0, delta_sum_b = 0;
			const color_rgba base_color(m_best_solution.m_coords.get_scaled_color());
			for (uint32_t r = 0; r < n; r++)
			{
				const uint32_t s = *pSelectors++;
				const int yd_temp = pInten_table[s];
				// Compute actual delta being applied to each pixel, taking into account clamping.
				delta_sum_r += clamp<int>(base_color.r + yd_temp, 0, 255) - base_color.r;
				delta_sum_g += clamp<int>(base_color.g + yd_temp, 0, 255) - base_color.g;
				delta_sum_b += clamp<int>(base_color.b + yd_temp, 0, 255) - base_color.b;
			}

			if ((!delta_sum_r) && (!delta_sum_g) && (!delta_sum_b))
				break;

			const float avg_delta_r_f = static_cast<float>(delta_sum_r) / n;
			const float avg_delta_g_f = static_cast<float>(delta_sum_g) / n;
			const float avg_delta_b_f = static_cast<float>(delta_sum_b) / n;
			const int br1 = clamp<int>(static_cast<int32_t>((m_avg_color[0] - avg_delta_r_f) * m_limit / 255.0f + .5f), 0, m_limit);
			const int bg1 = clamp<int>(static_cast<int32_t>((m_avg_color[1] - avg_delta_g_f) * m_limit / 255.0f + .5f), 0, m_limit);
			const int bb1 = clamp<int>(static_cast<int32_t>((m_avg_color[2] - avg_delta_b_f) * m_limit / 255.0f + .5f), 0, m_limit);

#if BASISU_DEBUG_ETC_ENCODER_DEEPER
			printf("Refinement trial %u, avg_delta %f %f %f\n", refinement_trial, avg_delta_r_f, avg_delta_g_f, avg_delta_b_f);
#endif

			if (!evaluate_solution(etc1_solution_coordinates(br1, bg1, bb1, 0, m_pParams->m_use_color4), m_trial_solution, &m_best_solution))
				break;

		}  // refinement_trial
	}